

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<float>::InternalDeallocate<true>(RepeatedField<float> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  HeapRep *pHVar4;
  HeapRep *pHVar5;
  int *key;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  RepeatedPtrFieldBase *this_03;
  iterator iVar6;
  undefined1 auStack_88 [8];
  undefined8 uStack_80;
  RepeatedField<bool> RStack_70;
  RepeatedField<double> RStack_48;
  RepeatedField<float> local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &heap_rep(this)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar3 = heap_rep(this);
    operator_delete(pHVar3,(long)iVar1 * 4 + 8);
    return;
  }
  this_00 = &local_20;
  InternalDeallocate<true>(this_00);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<double> *)this_00)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<double> *)this_00)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<double>::heap_rep((RepeatedField<double> *)this_00)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar4 = RepeatedField<double>::heap_rep((RepeatedField<double> *)this_00);
    operator_delete(pHVar4,(long)iVar1 * 8 + 8);
    return;
  }
  this_01 = &RStack_48;
  RepeatedField<double>::InternalDeallocate<true>(this_01);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<bool> *)this_01)->soo_rep_).field_0 &
      (undefined1  [16])0x4) == (undefined1  [16])0x0) {
    this_02 = &RStack_70;
    uStack_80 = internal::RepeatedPtrFieldBase::
                Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>;
    RepeatedField<bool>::InternalDeallocate<true>(this_02);
    key = (int *)(this_02->soo_rep_).field_0.long_rep.elements_int;
    if (key != (int *)0x0) {
      internal::RepeatedPtrFieldBase::
      Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
      return;
    }
    this_03 = (RepeatedPtrFieldBase *)auStack_88;
    internal::RepeatedPtrFieldBase::
    Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(this_03);
    iVar6 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::internal_find<int>
                      ((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)this_03,key);
    if (iVar6.node_ ==
        (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         *)0x0) {
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             *)this_03);
    }
    return;
  }
  iVar1 = (((RepeatedField<bool> *)this_01)->soo_rep_).field_0.long_rep.capacity;
  uStack_80._0_4_ = 0x148d0a;
  uStack_80._4_4_ = 0;
  paVar2 = &RepeatedField<bool>::heap_rep((RepeatedField<bool> *)this_01)->field_0;
  if (paVar2->arena != (Arena *)0x0) {
    return;
  }
  uStack_80._0_4_ = 0x148d24;
  uStack_80._4_4_ = 0;
  pHVar5 = RepeatedField<bool>::heap_rep((RepeatedField<bool> *)this_01);
  operator_delete(pHVar5,(long)iVar1 + 8);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }